

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O1

void * seq_writer_thread(void *args)

{
  uint uVar1;
  int iVar2;
  person_t p;
  person_t local_e34;
  
  iVar2 = 0;
  do {
    uVar1 = 0;
    do {
      gen_person(&local_e34);
      local_e34.age = uVar1;
      sprintf(local_e34.key,"person%d",(ulong)uVar1);
      e2e_fdb_set_person((storage_t *)args,&local_e34);
      uVar1 = uVar1 + 1;
    } while (uVar1 != 10000);
    e2e_fdb_commit(*args,true);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 10);
  return (void *)0x0;
}

Assistant:

void *seq_writer_thread(void *args) {

    int j, i = 0, n=10000;
    person_t p;
    storage_t *st = (storage_t *)args;
    for (j = 0; j < 10; ++j) {
        for (i = 0; i < n; ++i) {
            gen_person(&p);
            p.age = i;
            sprintf(p.key, "person%d", i);
            e2e_fdb_set_person(st, &p);
        }
        e2e_fdb_commit(st->main, true);
    }
    return NULL;
}